

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestContext *testCtx;
  int extraout_EAX;
  DrawTest *this_00;
  RenderContext *renderCtx;
  char *pcVar2;
  char *desc_00;
  IndexType type;
  IndexType type_00;
  bool bVar3;
  int local_1fc;
  string local_1f8;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  string iterationDesc;
  int iterationNdx;
  DrawTest *test;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string desc;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string name;
  IndexTest *indexTest;
  int testNdx;
  undefined1 local_98 [8];
  DrawTestSpec spec;
  IndexTest tests [3];
  IndexGroup *this_local;
  
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_98);
  genBasicSpec((DrawTestSpec *)local_98,this->m_method);
  spec.indexType = INDEXTYPE_SHORT;
  for (indexTest._0_4_ = 0; (int)indexTest < 3; indexTest._0_4_ = (int)indexTest + 1) {
    name.field_2._8_8_ = tests[(long)(int)indexTest + -1].offsets + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"index_",&local_f1);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)*(uint *)name.field_2._8_8_,type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"index ",&local_159);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)&test,(DrawTestSpec *)(ulong)*(uint *)name.field_2._8_8_,type_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&test);
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    this_00 = (DrawTest *)operator_new(0x138);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::DrawTest(this_00,testCtx,renderCtx,pcVar2,desc_00);
    spec.primitiveCount = *(int *)name.field_2._8_8_;
    iterationDesc.field_2._12_4_ = 0;
    while( true ) {
      bVar3 = false;
      if ((int)iterationDesc.field_2._12_4_ < 3) {
        bVar3 = *(int *)(name.field_2._8_8_ + 4 + (long)(int)iterationDesc.field_2._12_4_ * 4) != -1
        ;
      }
      if (!bVar3) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"first vertex ",&local_1d1);
      iVar1 = *(int *)(name.field_2._8_8_ + 4 + (long)(int)iterationDesc.field_2._12_4_ * 4);
      local_1fc = deqp::gls::DrawTestSpec::indexTypeSize(*(IndexType *)name.field_2._8_8_);
      local_1fc = iVar1 / local_1fc;
      de::toString<int>(&local_1f8,&local_1fc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     &local_1d0,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      spec.drawMethod =
           *(DrawMethod *)(name.field_2._8_8_ + 4 + (long)(int)iterationDesc.field_2._12_4_ * 4);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      deqp::gls::DrawTest::addIteration(this_00,(DrawTestSpec *)local_98,pcVar2);
      std::__cxx11::string::~string((string *)local_1b0);
      iterationDesc.field_2._12_4_ = iterationDesc.field_2._12_4_ + 1;
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_d0);
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_98);
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::IndexType	type;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::INDEXTYPE_BYTE,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::INDEXTYPE_SHORT,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::INDEXTYPE_INT,		{ 0, 4, -1 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("first vertex ") + de::toString(indexTest.offsets[iterationNdx] / gls::DrawTestSpec::indexTypeSize(indexTest.type));
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}